

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resource.h
# Opt level: O0

UnicodeString * __thiscall
icu_63::ResourceValue::getUnicodeString
          (UnicodeString *__return_storage_ptr__,ResourceValue *this,UErrorCode *errorCode)

{
  int iVar1;
  undefined4 extraout_var;
  ConstChar16Ptr local_38;
  char16_t *local_30;
  UChar *r;
  UErrorCode *pUStack_20;
  int32_t len;
  UErrorCode *errorCode_local;
  ResourceValue *this_local;
  
  r._4_4_ = 0;
  pUStack_20 = errorCode;
  errorCode_local = (UErrorCode *)this;
  this_local = (ResourceValue *)__return_storage_ptr__;
  iVar1 = (*(this->super_UObject)._vptr_UObject[4])(this,(long)&r + 4,errorCode);
  local_30 = (char16_t *)CONCAT44(extraout_var,iVar1);
  ConstChar16Ptr::ConstChar16Ptr(&local_38,local_30);
  UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_38,r._4_4_);
  ConstChar16Ptr::~ConstChar16Ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline UnicodeString getUnicodeString(UErrorCode &errorCode) const {
        int32_t len = 0;
        const UChar *r = getString(len, errorCode);
        return UnicodeString(TRUE, r, len);
    }